

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O2

void sdefl_huff(uchar *lens,uint *codes,uint *freqs,uint num_syms,uint max_code_len)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  uint len_cnt [16];
  uint local_4b8 [290];
  
  memset(local_4b8,0,0x480);
  uVar6 = num_syms + 3 & 0xfffffffc;
  uVar3 = uVar6 - 1;
  uVar15 = (ulong)uVar3;
  uVar14 = (ulong)num_syms;
  for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
    uVar8 = (ulong)freqs[uVar16];
    if (uVar3 <= freqs[uVar16]) {
      uVar8 = uVar15;
    }
    local_4b8[uVar8] = local_4b8[uVar8] + 1;
  }
  uVar11 = 0;
  for (uVar16 = 1; uVar16 < uVar6; uVar16 = uVar16 + 1) {
    uVar9 = local_4b8[uVar16];
    local_4b8[uVar16] = uVar11;
    uVar11 = uVar9 + uVar11;
  }
  for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
    uVar9 = freqs[uVar16];
    if (uVar9 == 0) {
      lens[uVar16] = '\0';
    }
    else {
      uVar8 = uVar15;
      if (uVar9 < uVar3) {
        uVar8 = (ulong)uVar9;
      }
      uVar10 = local_4b8[uVar8];
      local_4b8[uVar8] = uVar10 + 1;
      codes[uVar10] = (uint)uVar16 | uVar9 << 10;
    }
  }
  uVar3 = local_4b8[uVar6 - 2];
  puVar1 = codes + uVar3;
  uVar9 = local_4b8[uVar15] - uVar3;
  uVar6 = uVar9 >> 1;
  while (uVar6 != 0) {
    sdefl_heap_sub(codes + ((ulong)uVar3 - 1),uVar9,uVar6);
    uVar6 = uVar6 - 1;
  }
  uVar15 = (ulong)uVar9;
  while (1 < uVar15) {
    uVar6 = puVar1[uVar15 - 1];
    puVar1[uVar15 - 1] = *puVar1;
    uVar15 = uVar15 - 1;
    *puVar1 = uVar6;
    sdefl_heap_sub(codes + ((ulong)uVar3 - 1),(uint)uVar15,1);
  }
  if (uVar11 != 0) {
    if (uVar11 == 1) {
      uVar3 = (*codes & 0x3ff) + (uint)((*codes & 0x3ff) == 0);
      *codes = 0;
      *lens = '\x01';
      codes[uVar3] = 1;
      lens[uVar3] = '\x01';
    }
    else {
      iVar4 = 0;
      uVar15 = 0;
      uVar6 = 0;
      uVar3 = 0;
      uVar9 = uVar11;
      do {
        if ((uVar3 == uVar11) || ((uVar15 != uVar6 && (codes[uVar6] >> 10 < codes[uVar3] >> 10)))) {
          uVar10 = uVar3;
          uVar13 = uVar6 + 1;
          uVar12 = uVar6;
        }
        else {
          uVar10 = uVar3 + 1;
          uVar13 = uVar6;
          uVar12 = uVar3;
        }
        if ((uVar10 == uVar11) ||
           ((uVar15 != uVar13 && (codes[uVar13] >> 10 < codes[uVar10] >> 10)))) {
          uVar3 = uVar10;
          uVar10 = uVar13;
          uVar6 = uVar13 + 1;
        }
        else {
          uVar3 = uVar10 + 1;
          uVar6 = uVar13;
        }
        uVar13 = codes[uVar12];
        uVar2 = codes[uVar10];
        codes[uVar12] = (uVar13 & 0x3ff) + iVar4;
        codes[uVar10] = (codes[uVar10] & 0x3ff) + iVar4;
        codes[uVar15] = codes[uVar15] & 0x3ff | (uVar2 & 0xfffffc00) + (uVar13 & 0xfffffc00);
        uVar15 = uVar15 + 1;
        uVar9 = uVar9 - 1;
        iVar4 = iVar4 + 0x400;
      } while (1 < uVar9);
      uVar15 = (ulong)max_code_len;
      for (lVar7 = 0; uVar15 + 1 != lVar7; lVar7 = lVar7 + 1) {
        len_cnt[lVar7] = 0;
      }
      uVar16 = (ulong)(uVar11 - 2);
      len_cnt[1] = 2;
      codes[uVar16] = codes[uVar16] & 0x3ff;
      while (0 < (int)uVar16) {
        uVar16 = uVar16 - 1;
        uVar6 = codes[codes[uVar16] >> 10] >> 10;
        uVar8 = (ulong)uVar6 + 1;
        codes[uVar16] = (uint)uVar8 << 10 | codes[uVar16] & 0x3ff;
        uVar3 = max_code_len + 1;
        if ((uint)uVar8 < max_code_len) {
          uVar11 = len_cnt[(ulong)uVar6 + 1];
          uVar3 = uVar6 + 2;
        }
        else {
          do {
            uVar8 = (ulong)(uVar3 - 2);
            uVar11 = len_cnt[uVar8];
            uVar3 = uVar3 - 1;
          } while (uVar11 == 0);
        }
        len_cnt[uVar8] = uVar11 - 1;
        len_cnt[uVar3] = len_cnt[uVar3] + 2;
      }
      uVar3 = 0;
      uVar16 = uVar15;
      while (uVar8 = uVar16, uVar8 != 0) {
        uVar6 = len_cnt[uVar8];
        while (bVar17 = uVar6 != 0, uVar6 = uVar6 - 1, uVar16 = uVar8 - 1, bVar17) {
          uVar16 = (ulong)uVar3;
          uVar3 = uVar3 + 1;
          lens[codes[uVar16] & 0x3ff] = (uchar)uVar8;
        }
      }
      local_4b8[0] = 0;
      local_4b8[1] = 0;
      for (uVar16 = 2; uVar16 <= uVar15; uVar16 = uVar16 + 1) {
        local_4b8[uVar16] = (len_cnt[uVar16 - 1] + len_cnt[uVar16 + 0xf]) * 2;
      }
      for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        uVar3 = local_4b8[lens[uVar15]];
        local_4b8[lens[uVar15]] = uVar3 + 1;
        codes[uVar15] = uVar3;
      }
      for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        uVar5 = (ushort)codes[uVar15] << 8 | (ushort)codes[uVar15] >> 8;
        uVar3 = (uVar5 & 0xf0f) << 4 | uVar5 >> 4 & 0xf0f;
        uVar3 = (uVar3 >> 2 & 0x3333) + (uVar3 & 0x3333) * 4;
        codes[uVar15] = (uVar3 >> 1 & 0x5555) + (uVar3 & 0x5555) * 2 >> (0x10 - lens[uVar15] & 0x1f)
        ;
      }
    }
  }
  return;
}

Assistant:

static void
sdefl_huff(unsigned char *lens, unsigned *codes, unsigned *freqs,
           unsigned num_syms, unsigned max_code_len) {
  unsigned c, *A = codes;
  unsigned len_cnt[SDEFL_MAX_CODE_LEN + 1];
  unsigned used_syms = sdefl_sort_sym(num_syms, freqs, lens, A);
  if (!used_syms) return;
  if (used_syms == 1) {
    unsigned s = A[0] & SDEFL_SYM_MSK;
    unsigned i = s ? s : 1;
    codes[0] = 0, lens[0] = 1;
    codes[i] = 1, lens[i] = 1;
    return;
  }
  sdefl_build_tree(A, used_syms);
  sdefl_gen_len_cnt(A, used_syms-2, len_cnt, max_code_len);
  sdefl_gen_codes(A, lens, len_cnt, max_code_len, num_syms);
  for (c = 0; c < num_syms; c++) {
    codes[c] = sdefl_rev(codes[c], lens[c]);
  }
}